

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

void Curl_conncontrol(connectdata *conn,int ctrl)

{
  uint uVar1;
  bool bVar2;
  
  if (ctrl != 1) {
    if (ctrl == 2) {
      bVar2 = (conn->handler->flags & 0x200) == 0;
      if (!bVar2) {
        return;
      }
      ctrl = (int)bVar2;
    }
    else {
      ctrl = 0;
    }
  }
  uVar1 = *(uint *)&(conn->bits).field_0x4;
  if (ctrl != (uVar1 & 1)) {
    *(uint *)&(conn->bits).field_0x4 = uVar1 & 0xfffffffe | ctrl;
  }
  return;
}

Assistant:

const char *reason
#endif
  )
{
  /* close if a connection, or a stream that isn't multiplexed */
  bool closeit = (ctrl == CONNCTRL_CONNECTION) ||
    ((ctrl == CONNCTRL_STREAM) && !(conn->handler->flags & PROTOPT_STREAM));
  if((ctrl == CONNCTRL_STREAM) &&
     (conn->handler->flags & PROTOPT_STREAM))
    DEBUGF(infof(conn->data, "Kill stream: %s\n", reason));
  else if((bit)closeit != conn->bits.close) {
    DEBUGF(infof(conn->data, "Marked for [%s]: %s\n",
                 closeit?"closure":"keep alive", reason));
    conn->bits.close = closeit; /* the only place in the source code that
                                   should assign this bit */
  }
}